

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

void rgba_5551_to_argb_1555
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  ushort *puVar1;
  ushort *puVar2;
  ushort *puVar3;
  int iVar4;
  
  if (0 < height) {
    puVar2 = (ushort *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
    puVar3 = (ushort *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
    iVar4 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar2 + width;
        do {
          *puVar2 = *puVar3 >> 1 | (ushort)((*puVar3 & 1) != 0) << 0xf;
          puVar2 = puVar2 + 1;
          puVar3 = puVar3 + 1;
        } while (puVar2 < puVar1);
      }
      puVar3 = puVar3 + (src_pitch / 2 - width);
      puVar2 = puVar2 + (dst_pitch / 2 - width);
      iVar4 = iVar4 + 1;
    } while (iVar4 != height);
  }
  return;
}

Assistant:

static void rgba_5551_to_argb_1555(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGBA_5551_TO_ARGB_1555(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}